

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8to1,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  uint *puVar26;
  void *pvVar27;
  long lVar28;
  void *pvVar29;
  long lVar30;
  undefined4 uVar31;
  void *pvVar32;
  void *pvVar33;
  undefined2 *puVar34;
  void *pvVar35;
  ulong uVar36;
  undefined2 *puVar37;
  long lVar38;
  int k_1;
  undefined2 *puVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  void *pvVar43;
  void *pvVar44;
  undefined2 *puVar45;
  short tmp [6] [3];
  void *local_120;
  void *local_118;
  ulong local_110;
  void *local_f0;
  undefined1 local_a8 [64];
  size_t local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar41 = (ulong)(uint)outch;
  iVar18 = cpu_support_x86_avx2();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
              (kernel,kernel_tm_pack8to1,inch,outch,opt);
    return;
  }
  iVar18 = cpu_support_x86_xop();
  if (iVar18 == 0) {
    local_68 = 0;
    local_a8._0_8_ = (void *)0x0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_a8._16_8_ = 0;
    local_a8._24_4_ = 0;
    local_a8._32_8_ = (Allocator *)0x0;
    local_a8._40_4_ = 0;
    local_a8._44_4_ = 0;
    local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
    Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
    if (0 < outch) {
      pvVar44 = kernel->data;
      local_f0 = (void *)local_a8._0_8_;
      local_110 = 0;
      do {
        if (0 < inch) {
          iVar18 = inch * 9 * (int)local_110;
          uVar20 = 0;
          pvVar23 = local_f0;
          do {
            lVar42 = uVar20 * 9;
            cVar1 = *(char *)((long)pvVar44 + lVar42 + iVar18);
            cVar2 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 1);
            cVar3 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 2);
            cVar4 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 3);
            cVar5 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 4);
            cVar6 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 5);
            cVar7 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 6);
            cVar8 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 7);
            cVar9 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 8);
            lVar42 = 4;
            do {
              sVar10 = *(short *)(&UNK_0051a45c + lVar42);
              sVar11 = *(short *)(&UNK_0051a45e + lVar42);
              sVar12 = *(short *)((long)&DAT_0051a460 + lVar42);
              *(short *)((long)&local_60 + lVar42 + 4) =
                   sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
              *(short *)((long)&local_60 + lVar42 + 6) =
                   sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
              *(short *)((long)auStack_56 + lVar42 + -2) =
                   sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
              lVar42 = lVar42 + 6;
            } while (lVar42 != 0x28);
            lVar42 = 0;
            pvVar19 = pvVar23;
            do {
              sVar10 = *(short *)((long)auStack_56 + lVar42 * 6 + -2);
              uVar13 = *(uint *)((long)auStack_56 + lVar42 * 6);
              puVar26 = &DAT_0051a462;
              lVar28 = 0;
              do {
                auVar16 = vpmullw_avx(ZEXT416(*puVar26),ZEXT416(uVar13));
                uVar31 = vpextrw_avx(auVar16,1);
                *(short *)((long)pvVar19 + lVar28 * 2) =
                     (short)uVar31 + auVar16._0_2_ + *(short *)((long)puVar26 + -2) * sVar10;
                lVar28 = lVar28 + 1;
                puVar26 = (uint *)((long)puVar26 + 6);
              } while (lVar28 != 6);
              lVar42 = lVar42 + 1;
              pvVar19 = (void *)((long)pvVar19 + 0xc);
            } while (lVar42 != 6);
            uVar20 = uVar20 + 1;
            pvVar23 = (void *)((long)pvVar23 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
          } while (uVar20 != (uint)inch);
        }
        local_110 = local_110 + 1;
        local_f0 = (void *)((long)local_f0 + local_68 * local_a8._16_8_);
      } while (local_110 != uVar41);
    }
    iVar18 = outch + 3;
    if (-1 < outch) {
      iVar18 = outch;
    }
    Mat::create(kernel_tm_pack8to1,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
    uVar20 = 0;
    if (3 < outch) {
      iVar18 = kernel_tm_pack8to1->w;
      pvVar23 = kernel_tm_pack8to1->data;
      sVar14 = kernel_tm_pack8to1->elemsize;
      sVar15 = kernel_tm_pack8to1->cstep;
      lVar28 = local_a8._16_8_ * local_68;
      pvVar32 = (void *)(lVar28 * 3 + local_a8._0_8_);
      local_60 = lVar28 * 4;
      lVar42 = (long)(int)local_a8._44_4_ * local_a8._16_8_ * 8;
      pvVar44 = (void *)(local_a8._0_8_ + lVar28 * 2);
      pvVar29 = (void *)(lVar28 + local_a8._0_8_);
      uVar21 = 0;
      pvVar19 = (void *)local_a8._0_8_;
      do {
        lVar28 = 0;
        pvVar33 = pvVar32;
        pvVar43 = pvVar44;
        local_120 = pvVar29;
        local_118 = pvVar19;
        do {
          if (7 < inch) {
            lVar30 = (long)pvVar23 +
                     (long)iVar18 * sVar14 * lVar28 + (uVar21 >> 2) * sVar15 * sVar14;
            pvVar22 = local_118;
            lVar24 = 0;
            pvVar25 = pvVar43;
            pvVar27 = local_120;
            pvVar35 = pvVar33;
            do {
              lVar40 = 0;
              lVar38 = 0;
              do {
                *(undefined2 *)(lVar30 + lVar40) = *(undefined2 *)((long)pvVar22 + lVar38);
                *(undefined2 *)(lVar30 + lVar40 + 2) = *(undefined2 *)((long)pvVar27 + lVar38);
                *(undefined2 *)(lVar30 + lVar40 + 4) = *(undefined2 *)((long)pvVar25 + lVar38);
                *(undefined2 *)(lVar30 + lVar40 + 6) = *(undefined2 *)((long)pvVar35 + lVar38);
                lVar38 = lVar38 + (long)(int)local_a8._44_4_ * local_a8._16_8_;
                lVar40 = lVar40 + 8;
              } while (lVar40 != 0x40);
              lVar38 = lVar24 + 0xf;
              pvVar35 = (void *)((long)pvVar35 + lVar42);
              pvVar25 = (void *)((long)pvVar25 + lVar42);
              pvVar27 = (void *)((long)pvVar27 + lVar42);
              pvVar22 = (void *)((long)pvVar22 + lVar42);
              lVar30 = lVar30 + 0x40;
              lVar24 = lVar24 + 8;
            } while (lVar38 < inch);
          }
          lVar28 = lVar28 + 1;
          pvVar33 = (void *)((long)pvVar33 + 2);
          pvVar43 = (void *)((long)pvVar43 + 2);
          local_120 = (void *)((long)local_120 + 2);
          local_118 = (void *)((long)local_118 + 2);
        } while (lVar28 != 0x24);
        uVar20 = uVar21 + 4;
        uVar36 = uVar21 + 7;
        pvVar32 = (void *)((long)pvVar32 + local_60);
        pvVar44 = (void *)((long)pvVar44 + local_60);
        pvVar29 = (void *)((long)pvVar29 + local_60);
        pvVar19 = (void *)((long)pvVar19 + local_60);
        uVar21 = uVar20;
      } while (uVar36 < uVar41);
    }
    if ((int)uVar20 < outch) {
      iVar18 = kernel_tm_pack8to1->w;
      pvVar44 = kernel_tm_pack8to1->data;
      sVar14 = kernel_tm_pack8to1->elemsize;
      sVar15 = kernel_tm_pack8to1->cstep;
      uVar20 = uVar20 & 0xffffffff;
      puVar34 = (undefined2 *)(local_68 * local_a8._16_8_ * uVar20 + local_a8._0_8_);
      do {
        lVar42 = 0;
        puVar37 = puVar34;
        do {
          if (7 < inch) {
            lVar24 = (long)pvVar44 +
                     (long)iVar18 * sVar14 * lVar42 +
                     (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                     sVar15 * sVar14;
            lVar28 = 0;
            puVar45 = puVar37;
            do {
              lVar30 = 0;
              puVar39 = puVar45;
              do {
                *(undefined2 *)(lVar24 + lVar30) = *puVar39;
                puVar39 = (undefined2 *)
                          ((long)puVar39 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
                lVar30 = lVar30 + 2;
              } while (lVar30 != 0x10);
              lVar30 = lVar28 + 0xf;
              puVar45 = puVar45 + (long)(int)local_a8._44_4_ * local_a8._16_8_ * 4;
              lVar24 = lVar24 + 0x10;
              lVar28 = lVar28 + 8;
            } while (lVar30 < inch);
          }
          lVar42 = lVar42 + 1;
          puVar37 = puVar37 + 1;
        } while (lVar42 != 0x24);
        uVar20 = uVar20 + 1;
        puVar34 = (undefined2 *)((long)puVar34 + local_68 * local_a8._16_8_);
      } while (uVar20 != uVar41);
    }
    piVar17 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_a8._0_8_ != (void *)0x0) {
            free((void *)local_a8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_a8._32_8_)[3])();
        }
      }
    }
    return;
  }
  conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
            (kernel,kernel_tm_pack8to1,inch,outch,opt);
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8to1, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx512vnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avxvnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8to1.create(8 * inch / 8, 36, outch / 4 + outch % 4, (size_t)2u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        const Mat k0 = kernel_tm.channel(p);
        const Mat k1 = kernel_tm.channel(p + 1);
        const Mat k2 = kernel_tm.channel(p + 2);
        const Mat k3 = kernel_tm.channel(p + 3);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
#if __AVXVNNI__ || __AVX512VNNI__ || __XOP__
                for (int i = 0; i < 4; i++)
                {
                    const short* k00 = k0.row<const short>(q + i * 2);
                    const short* k10 = k1.row<const short>(q + i * 2);
                    const short* k20 = k2.row<const short>(q + i * 2);
                    const short* k30 = k3.row<const short>(q + i * 2);

                    const short* k01 = k0.row<const short>(q + i * 2 + 1);
                    const short* k11 = k1.row<const short>(q + i * 2 + 1);
                    const short* k21 = k2.row<const short>(q + i * 2 + 1);
                    const short* k31 = k3.row<const short>(q + i * 2 + 1);

                    g00[0] = k00[k];
                    g00[1] = k01[k];
                    g00[2] = k10[k];
                    g00[3] = k11[k];
                    g00[4] = k20[k];
                    g00[5] = k21[k];
                    g00[6] = k30[k];
                    g00[7] = k31[k];

                    g00 += 8;
                }
#else
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];
                    g00[1] = k1.row<const short>(q + i)[k];
                    g00[2] = k2.row<const short>(q + i)[k];
                    g00[3] = k3.row<const short>(q + i)[k];

                    g00 += 4;
                }
#endif
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4 + p % 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];

                    g00 += 1;
                }
            }
        }
    }
}